

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O0

sexp_conflict sexp_free_sizes(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_free_list_conflict q;
  sexp_heap_conflict h;
  sexp_sint_t i;
  sexp_uint_t sizes [512];
  size_t freed;
  ulong local_1078;
  undefined8 *local_1070;
  undefined8 local_1068;
  undefined8 local_1060;
  sexp_conflict *local_1058;
  undefined8 local_1050;
  sexp_conflict local_1048;
  long *local_1040;
  long local_1038;
  long local_1030;
  long alStack_1028 [513];
  undefined1 local_20 [24];
  long local_8;
  
  local_1038 = *(long *)(in_RDI + 0x70);
  local_1048 = (sexp_conflict)0x43e;
  local_8 = in_RDI;
  memset(&local_1058,0,0x10);
  local_1060 = 0x43e;
  memset(&local_1070,0,0x10);
  sexp_gc(local_8,local_20);
  for (local_1030 = 0; local_1030 < 0x200; local_1030 = local_1030 + 1) {
    alStack_1028[local_1030] = 0;
  }
  for (; local_1038 != 0; local_1038 = *(long *)(local_1038 + 0x20)) {
    for (local_1040 = *(long **)(local_1038 + 0x18); local_1040 != (long *)0x0;
        local_1040 = (long *)local_1040[1]) {
      if (*local_1040 + 0x1fU >> 5 < 0x200) {
        local_1078 = *local_1040 + 0x1fU >> 5;
      }
      else {
        local_1078 = 0x1ff;
      }
      alStack_1028[local_1078] = alStack_1028[local_1078] + 1;
    }
  }
  local_1058 = &local_1048;
  local_1050 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_1058;
  local_1070 = &local_1060;
  local_1068 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_1070;
  local_1048 = (sexp_conflict)0x23e;
  for (local_1030 = 0x1ff; -1 < local_1030; local_1030 = local_1030 + -1) {
    if (alStack_1028[local_1030] != 0) {
      local_1060 = sexp_cons_op(local_8,0,2,local_1030 << 1 | 1,alStack_1028[local_1030] << 1 | 1);
      local_1048 = (sexp_conflict)sexp_cons_op(local_8,0,2,local_1060,local_1048);
    }
  }
  *(undefined8 *)(local_8 + 0x6080) = local_1050;
  return local_1048;
}

Assistant:

static sexp sexp_free_sizes (sexp ctx, sexp self, sexp_sint_t n) {
  size_t freed;
  sexp_uint_t sizes[512];
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp_free_list q;
  sexp_gc_var2(res, tmp);

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<512; i++)
    sizes[i]=0;

  /* loop over each free block */
  for ( ; h; h=h->next)
    for (q=h->free_list; q; q=q->next)
      sizes[sexp_heap_chunks(q->size) > 511 ? 511 : sexp_heap_chunks(q->size)]++;

  /* build and return results */
  sexp_gc_preserve2(ctx, res, tmp);
  res = SEXP_NULL;
  for (i=511; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  sexp_gc_release2(ctx);
  return res;
}